

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O2

bool __thiscall Initialize::CreateFiles(Initialize *this)

{
  char cVar1;
  Tools *pTVar2;
  reference pvVar3;
  Logger *pLVar4;
  bool bVar5;
  int i;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_4b8;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ifstream file;
  ofstream newFile;
  
  std::ofstream::ofstream(&newFile);
  std::ifstream::ifstream(&file);
  uVar6 = 0;
  while( true ) {
    pTVar2 = Tools::getInstance();
    if ((ulong)((long)(pTVar2->fileNames->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar2->fileNames->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    std::operator+(&local_478,&this->path,"/");
    pTVar2 = Tools::getInstance();
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar2->fileNames,uVar6);
    std::operator+(&bStack_4b8,&local_478,pvVar3);
    std::ofstream::open((string *)&newFile,(_Ios_Openmode)&bStack_4b8);
    std::__cxx11::string::~string((string *)&bStack_4b8);
    std::__cxx11::string::~string((string *)&local_478);
    std::ofstream::close();
    uVar6 = uVar6 + 1;
  }
  bVar5 = true;
  uVar6 = 0;
  while( true ) {
    pTVar2 = Tools::getInstance();
    if ((ulong)((long)(pTVar2->fileNames->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar2->fileNames->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    std::operator+(&local_478,&this->path,"/");
    pTVar2 = Tools::getInstance();
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar2->fileNames,uVar6);
    std::operator+(&bStack_4b8,&local_478,pvVar3);
    std::ifstream::open((string *)&file,(_Ios_Openmode)&bStack_4b8);
    std::__cxx11::string::~string((string *)&bStack_4b8);
    std::__cxx11::string::~string((string *)&local_478);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      pLVar4 = Logger::getInstance();
      pTVar2 = Tools::getInstance();
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(pTVar2->fileNames,uVar6);
      std::operator+(&bStack_4b8,"File - ",pvVar3);
      std::operator+(&local_458,&bStack_4b8,"didn\'t create");
      Logger::LogError(pLVar4,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&bStack_4b8);
      bVar5 = false;
    }
    std::ifstream::close();
    uVar6 = uVar6 + 1;
  }
  if (bVar5) {
    pLVar4 = Logger::getInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,"All files created successfully",(allocator<char> *)&bStack_4b8)
    ;
    Logger::LogInformation(pLVar4,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
  }
  std::ifstream::~ifstream(&file);
  std::ofstream::~ofstream(&newFile);
  return bVar5;
}

Assistant:

bool CreateFiles() {
        ofstream newFile;
        ifstream file;
        bool isCreated = true;

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            newFile.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            newFile.close();
        }

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError("File - " + Tools::getInstance()->fileNames->at(i) + "didn't create");
                isCreated = false;
            }

            file.close();
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("All files created successfully");
        }

        return isCreated;
    }